

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::bracketElse(Forth *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined1 local_48 [8];
  string currentWord;
  CAddr caddr;
  size_t length;
  int level;
  Forth *this_local;
  
  length._4_4_ = 1;
  do {
    while (iVar2 = getSourceBufferRemain(this), iVar2 < 1) {
LAB_0011d691:
      refillNextLine(this);
    }
    bl(this);
    word(this);
    count(this);
    uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
    pop(this);
    currentWord.field_2._12_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
    pop(this);
    if ((ulong)uVar3 == 0) goto LAB_0011d691;
    std::__cxx11::string::string((string *)local_48);
    moveFromDataSpace(this,(string *)local_48,currentWord.field_2._12_4_,(ulong)uVar3);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,"[IF]");
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                      "[ELSE]");
      if (iVar2 != 0) {
        iVar2 = length._4_4_ + -1;
        if (length._4_4_ + -1 != 0) {
          iVar2 = length._4_4_;
        }
        goto LAB_0011d66d;
      }
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                      "[THEN]");
      if (iVar2 != 0) {
        length._4_4_ = length._4_4_ + -1;
      }
      iVar2 = length._4_4_;
      if (length._4_4_ != 0) goto LAB_0011d66d;
      bVar1 = true;
    }
    else {
      iVar2 = length._4_4_ + 1;
LAB_0011d66d:
      length._4_4_ = iVar2;
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void bracketElse(){
			int level = 1;
			while (true){
				while (getSourceBufferRemain() > 0 ) {
					bl();
					word();
					count();
					auto length = SIZE_T(dStack.getTop()); pop();
					auto caddr = CADDR(dStack.getTop()); pop();
					if (length > 0) {
						std::string currentWord{};
						moveFromDataSpace(currentWord, caddr, length);
						if (currentWord.compare("[IF]")) { level++; }
						else {
							if (currentWord.compare("[ELSE]")) { level--; if (level) level++; }
							else {
								if (currentWord.compare("[THEN]")) { level--; }
								if (level == 0) return;
							}
						}
					}
					else {
						break;
					}
				}
				refillNextLine();
			}
		}